

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjTerSimGet1Fanin0(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined1 local_12;
  undefined1 local_11;
  Gia_Obj_t *pObj_local;
  
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGet0(pGVar2);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    local_11 = 1;
    if (iVar1 != 0) goto LAB_00a0b2ce;
  }
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGet1(pGVar2);
  local_12 = 0;
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    local_12 = iVar1 != 0 ^ 0xff;
  }
  local_11 = local_12;
LAB_00a0b2ce:
  return (int)(local_11 & 1);
}

Assistant:

static inline int  Gia_ObjTerSimGet1Fanin0( Gia_Obj_t * pObj ) { return (Gia_ObjTerSimGet0(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj)) || (Gia_ObjTerSimGet1(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj)); }